

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::SupportVectorClassifier::SharedDtor(SupportVectorClassifier *this)

{
  if ((this != (SupportVectorClassifier *)&_SupportVectorClassifier_default_instance_) &&
     (this->kernel_ != (Kernel *)0x0)) {
    (*(this->kernel_->super_MessageLite)._vptr_MessageLite[1])();
  }
  if (this->_oneof_case_[0] != 0) {
    clear_supportVectors(this);
  }
  if (this->_oneof_case_[1] != 0) {
    clear_ClassLabels(this);
    return;
  }
  return;
}

Assistant:

void SupportVectorClassifier::SharedDtor() {
  if (this != internal_default_instance()) {
    delete kernel_;
  }
  if (has_supportVectors()) {
    clear_supportVectors();
  }
  if (has_ClassLabels()) {
    clear_ClassLabels();
  }
}